

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lights.cpp
# Opt level: O2

string * __thiscall
pbrt::GoniometricLight::ToString_abi_cxx11_(string *__return_storage_ptr__,GoniometricLight *this)

{
  float *in_R9;
  string sStack_38;
  
  LightBase::BaseToString_abi_cxx11_(&sStack_38,&this->super_LightBase);
  StringPrintf<std::__cxx11::string,pbrt::DenselySampledSpectrum_const&,float_const&>
            (__return_storage_ptr__,(pbrt *)"[ GoniometricLight %s I: %s scale: %f ]",
             (char *)&sStack_38,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&this->I,
             (DenselySampledSpectrum *)&this->scale,in_R9);
  std::__cxx11::string::~string((string *)&sStack_38);
  return __return_storage_ptr__;
}

Assistant:

std::string GoniometricLight::ToString() const {
    return StringPrintf("[ GoniometricLight %s I: %s scale: %f ]", BaseToString(), I,
                        scale);
}